

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.hpp
# Opt level: O3

unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_> __thiscall
TasGrid::GridReaderVersion5<TasGrid::GridSequence>::read<TasGrid::IO::mode_binary_type>
          (GridReaderVersion5<TasGrid::GridSequence> *this,AccelerationContext *acc,istream *is)

{
  TypeOneDRule TVar1;
  GridSequence *this_00;
  unsigned_long num_entries;
  pointer *__ptr;
  size_t sVar2;
  size_t sVar3;
  int v;
  MultiIndexSet local_70;
  vector<double,_std::allocator<double>_> local_48;
  
  this_00 = (GridSequence *)operator_new(0x120);
  (this_00->super_BaseCanonicalGrid).acceleration = acc;
  (this_00->super_BaseCanonicalGrid).num_dimensions = 0;
  (this_00->super_BaseCanonicalGrid).num_outputs = 0;
  (this_00->super_BaseCanonicalGrid).points.num_dimensions = 0;
  (this_00->super_BaseCanonicalGrid).points.cache_num_indexes = 0;
  (this_00->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->super_BaseCanonicalGrid).needed.num_dimensions = 0;
  (this_00->super_BaseCanonicalGrid).needed.cache_num_indexes = 0;
  (this_00->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->super_BaseCanonicalGrid).values.num_outputs = 0;
  (this_00->super_BaseCanonicalGrid).values.num_values = 0;
  (this_00->super_BaseCanonicalGrid).values.values.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this_00->super_BaseCanonicalGrid).values.values.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this_00->super_BaseCanonicalGrid).values.values.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this_00->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid =
       (_func_int **)&PTR__GridSequence_001f77c0;
  this_00->rule = rule_none;
  memset(&this_00->surpluses,0,0x88);
  *(GridSequence **)this = this_00;
  ::std::istream::read((char *)is,(long)&local_70);
  num_entries = local_70.num_dimensions & 0xffffffff;
  (this_00->super_BaseCanonicalGrid).num_dimensions = (int)local_70.num_dimensions;
  ::std::istream::read((char *)is,(long)&local_70);
  (this_00->super_BaseCanonicalGrid).num_outputs = (int)local_70.num_dimensions;
  TVar1 = IO::readRule<TasGrid::IO::mode_binary_type>(is);
  this_00->rule = TVar1;
  ::std::istream::read((char *)is,(long)&local_70);
  if ((char)local_70.num_dimensions == 'y') {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>(&local_70,is);
    (this_00->super_BaseCanonicalGrid).points.cache_num_indexes = local_70.cache_num_indexes;
    (this_00->super_BaseCanonicalGrid).points.num_dimensions = local_70.num_dimensions;
    ::std::vector<int,_std::allocator<int>_>::operator=
              (&(this_00->super_BaseCanonicalGrid).points.indexes,&local_70.indexes);
    if ((pointer)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  ::std::istream::read((char *)is,(long)&local_70);
  if ((char)local_70.num_dimensions == 'y') {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>(&local_70,is);
    (this_00->super_BaseCanonicalGrid).needed.cache_num_indexes = local_70.cache_num_indexes;
    (this_00->super_BaseCanonicalGrid).needed.num_dimensions = local_70.num_dimensions;
    ::std::vector<int,_std::allocator<int>_>::operator=
              (&(this_00->super_BaseCanonicalGrid).needed.indexes,&local_70.indexes);
    if ((pointer)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  ::std::istream::read((char *)is,(long)&local_70);
  if ((char)local_70.num_dimensions == 'y') {
    sVar3 = (size_t)(this_00->super_BaseCanonicalGrid).num_outputs;
    sVar2 = (size_t)(this_00->super_BaseCanonicalGrid).points.cache_num_indexes;
    IO::readVector<TasGrid::IO::mode_binary_type,double,unsigned_long>
              (&local_48,(IO *)is,(istream *)(sVar2 * sVar3),num_entries);
    local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
    local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    (this_00->surpluses).stride = sVar3;
    (this_00->surpluses).num_strips = sVar2;
    local_70.num_dimensions = sVar3;
    local_70._8_8_ = sVar2;
    ::std::vector<double,_std::allocator<double>_>::operator=
              (&(this_00->surpluses).vec,
               (vector<double,_std::allocator<double>_> *)&local_70.indexes);
    if ((pointer)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (0 < (this_00->super_BaseCanonicalGrid).num_outputs) {
    StorageSet::StorageSet<TasGrid::IO::mode_binary_type>((StorageSet *)&local_70,is);
    (this_00->super_BaseCanonicalGrid).values.num_outputs = local_70.num_dimensions;
    (this_00->super_BaseCanonicalGrid).values.num_values = local_70._8_8_;
    ::std::vector<double,_std::allocator<double>_>::operator=
              (&(this_00->super_BaseCanonicalGrid).values.values,
               (vector<double,_std::allocator<double>_> *)&local_70.indexes);
    if ((pointer)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  GridSequence::prepareSequence(this_00,0);
  return (__uniq_ptr_data<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>,_true,_true>
          )(__uniq_ptr_data<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr<GridSequence> read(AccelerationContext const *acc, std::istream &is){
        std::unique_ptr<GridSequence> grid = Utils::make_unique<GridSequence>(acc);

        grid->num_dimensions = IO::readNumber<iomode, int>(is);
        grid->num_outputs = IO::readNumber<iomode, int>(is);
        grid->rule = IO::readRule<iomode>(is);

        if (IO::readFlag<iomode>(is)) grid->points = MultiIndexSet(is, iomode());
        if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());

        if (IO::readFlag<iomode>(is))
            grid->surpluses = IO::readData2D<iomode, double>(is, grid->num_outputs, grid->points.getNumIndexes());

        if (grid->num_outputs > 0) grid->values = StorageSet(is, iomode());

        grid->prepareSequence(0);

        return grid;
    }